

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O2

void Genetic::clear(void)

{
  Solution *this;
  iterator __end1;
  list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_> *plVar1;
  
  plVar1 = &solutions_abi_cxx11_;
  while (plVar1 = (list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                   *)(plVar1->
                     super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next,
        plVar1 != &solutions_abi_cxx11_) {
    this = *(Solution **)((long)plVar1 + 0x10);
    if (this != (Solution *)0x0) {
      Solution::~Solution(this);
    }
    operator_delete(this);
  }
  std::__cxx11::list<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
  ::clear(&solutions_abi_cxx11_);
  ticket_max = 0.0;
  max_weight = 0.0;
  return;
}

Assistant:

void Genetic::clear()
{
	for (auto solution : solutions)
	{
		delete solution.first;
	}
	solutions.clear();
	ticket_max = 0;
	max_weight = 0;
}